

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helics-broker.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  element_type *peVar1;
  ParseOutput PVar2;
  App *pAVar3;
  Option *pOVar4;
  ostream *poVar5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  allocator<char> local_78e;
  bool websocket_server;
  bool http_server;
  bool autorestart;
  bool runremote;
  bool runterminal;
  shared_ptr<helics::apps::WebServer> webserver;
  allocator<char> local_769;
  BrokerKeeper broker;
  int argc_local;
  char **argv_local;
  string mWebSocketArgs;
  string mHttpArgs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6d0;
  string local_6b8;
  string local_698;
  string local_678;
  string local_658;
  string local_638;
  string local_618;
  string local_5f8;
  string local_5d8;
  string local_5b8;
  string local_598;
  string local_578;
  string local_558;
  string local_538;
  string local_518;
  string local_4f8;
  string local_4d8;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  _Any_data local_438;
  code *local_428;
  code *local_420;
  _Any_data local_410;
  code *local_400;
  code *local_3f8;
  _Any_data local_3f0;
  code *local_3e0;
  code *local_3d8;
  helicsCLI11App cmdLine;
  
  runterminal = false;
  runremote = false;
  autorestart = false;
  http_server = false;
  mHttpArgs._M_dataplus._M_p = (pointer)&mHttpArgs.field_2;
  mHttpArgs._M_string_length = 0;
  websocket_server = false;
  mHttpArgs.field_2._M_local_buf[0] = '\0';
  mWebSocketArgs._M_dataplus._M_p = (pointer)&mWebSocketArgs.field_2;
  mWebSocketArgs._M_string_length = 0;
  mWebSocketArgs.field_2._M_local_buf[0] = '\0';
  argc_local = argc;
  argv_local = argv;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4b8,"helics broker command line",(allocator<char> *)&webserver);
  std::__cxx11::string::string<std::allocator<char>>((string *)&broker,"",&local_78e);
  helics::helicsCLI11App::helicsCLI11App(&cmdLine,&local_4b8,(string *)&broker);
  std::__cxx11::string::~string((string *)&broker);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4d8,"term",(allocator<char> *)&broker);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4f8,
             "helics_broker term <broker args...> will start a broker and open a terminal control window for the broker run help in a terminal for more commands\n"
             ,(allocator<char> *)&webserver);
  pAVar3 = CLI::App::add_subcommand(&cmdLine.super_App,&local_4d8,&local_4f8);
  pAVar3->prefix_command_ = true;
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  local_3f0._8_8_ = 0;
  local_3f0._M_unused._M_object = &runterminal;
  local_3d8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:57:20)>
              ::_M_invoke;
  local_3e0 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:57:20)>
              ::_M_manager;
  CLI::App::callback(pAVar3,(function<void_()> *)&local_3f0);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_518,"remote",(allocator<char> *)&broker);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,
             "helics_broker remote <connection args>  will start a terminal and connect to a remote HELICS rest API and allow sending API commands through a terminal"
             ,(allocator<char> *)&webserver);
  pAVar3 = CLI::App::add_subcommand(&cmdLine.super_App,&local_518,&local_538);
  pAVar3->prefix_command_ = true;
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_518);
  local_410._8_8_ = 0;
  local_410._M_unused._M_object = &runremote;
  local_3f8 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:65:22)>
              ::_M_invoke;
  local_400 = CLI::std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:65:22)>
              ::_M_manager;
  CLI::App::callback(pAVar3,(function<void_()> *)&local_410);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_410);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_558,"--autorestart",(allocator<char> *)&broker);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_578,
             "helics_broker --autorestart <broker args ...> will start a continually regenerating broker there is a 3 second countdown on broker completion to halt the program via ctrl-C\n"
             ,(allocator<char> *)&webserver);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&cmdLine.super_App,&local_558,&autorestart,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_598,"--http,--web",(allocator<char> *)&broker);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b8,"start a webserver to respond to http rest api requests",
             (allocator<char> *)&webserver);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&cmdLine.super_App,&local_598,&http_server,&local_5b8);
  std::__cxx11::string::~string((string *)&local_5b8);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5d8,"--websocket",(allocator<char> *)&broker);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5f8,"start a websocket server to respond to api requests",
             (allocator<char> *)&webserver);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (&cmdLine.super_App,&local_5d8,&websocket_server,&local_5f8);
  std::__cxx11::string::~string((string *)&local_5f8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_618,"--http_server_args",(allocator<char> *)&broker);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_638,"command line arguments for the http server",
             (allocator<char> *)&webserver);
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&cmdLine.super_App,&local_618,&mHttpArgs,&local_638);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_458,"HELICS_HTTP_ARGS",&local_78e);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->envname_,&local_458);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_638);
  std::__cxx11::string::~string((string *)&local_618);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_658,"--websocket_server_args",(allocator<char> *)&broker);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_678,"command line arguments for the websocket server",
             (allocator<char> *)&webserver);
  pOVar4 = CLI::App::
           add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                     (&cmdLine.super_App,&local_658,&mWebSocketArgs,&local_678);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_478,"HELICS_WEBSOCKET_ARGS",&local_78e);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&pOVar4->envname_,&local_478);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_678);
  std::__cxx11::string::~string((string *)&local_658);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,
             "helics_broker <broker args ..> starts a broker with the given args and waits for it to complete\n"
             ,(allocator<char> *)&broker);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
            (&cmdLine.super_App.footer_,&local_498);
  local_438._M_unused._M_object = (void *)0x0;
  local_438._8_8_ = 0;
  local_420 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:94:18)>
              ::_M_invoke;
  local_428 = CLI::std::
              _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/helics-broker.cpp:94:18)>
              ::_M_manager;
  CLI::std::
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
  operator=(&cmdLine.super_App.footer_callback_,
            (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
             *)&local_438);
  CLI::std::_Function_base::~_Function_base((_Function_base *)&local_438);
  std::__cxx11::string::~string((string *)&local_498);
  cmdLine.super_App.allow_extras_ = true;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_698,"",(allocator<char> *)&webserver);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b8,"",&local_78e);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&broker,"Read an ini file",&local_769);
  CLI::App::set_config(&cmdLine.super_App,&local_698,&local_6b8,(string *)&broker,false);
  std::__cxx11::string::~string((string *)&broker);
  std::__cxx11::string::~string((string *)&local_6b8);
  std::__cxx11::string::~string((string *)&local_698);
  helics::helicsCLI11App::addSystemInfoCall(&cmdLine);
  PVar2 = helics::helicsCLI11App::helics_parse<int&,char**&>(&cmdLine,&argc_local,&argv_local);
  if (PVar2 != OK) {
    PVar2 = PVar2 >> 0x1f & PVar2;
    goto LAB_001720d9;
  }
  webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if ((http_server != false) || (websocket_server == true)) {
    CLI::std::make_shared<helics::apps::WebServer>();
    CLI::std::__shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2> *)&broker);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&broker.brk.broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    mHttpEnabled = http_server;
    if (mHttpArgs._M_string_length != 0) {
      (*((webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                (webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,mHttpArgs._M_string_length,mHttpArgs._M_dataplus._M_p);
    }
    (webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
    mWebsocketEnabled = websocket_server;
    if (mWebSocketArgs._M_string_length != 0) {
      (*((webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_TypedBrokerServer)._vptr_TypedBrokerServer[4])
                (webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,mWebSocketArgs._M_string_length,mWebSocketArgs._M_dataplus._M_p);
    }
    peVar1 = webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    std::__shared_ptr<helics::apps::TypedBrokerServer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<helics::apps::WebServer,void>
              ((__shared_ptr<helics::apps::TypedBrokerServer,(__gnu_cxx::_Lock_policy)2> *)&broker,
               &webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>);
    (*(peVar1->super_TypedBrokerServer)._vptr_TypedBrokerServer[2])
              (peVar1,0,(__shared_ptr<helics::apps::TypedBrokerServer,(__gnu_cxx::_Lock_policy)2> *)
                        &broker);
    CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&broker.brk.broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  if (runterminal == true) {
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_6d0,&cmdLine.remArgs);
    terminalFunction(&local_6d0);
    this = &local_6d0;
LAB_0017208e:
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
  }
  else {
    if (runremote == true) {
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_6e8,&cmdLine.remArgs);
      remoteTerminalFunction(&local_6e8);
      this = &local_6e8;
      goto LAB_0017208e;
    }
    if (autorestart == true) {
      do {
        helics::BrokerApp::BrokerApp(&broker.brk,&cmdLine.remArgs);
        helics::BrokerKeeper::~BrokerKeeper((BrokerKeeper *)&broker.brk);
        poVar5 = std::operator<<((ostream *)&std::cout,"broker restart in 3 seconds");
        std::endl<char,std::char_traits<char>>(poVar5);
        broker.brk.broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x1;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)&broker.brk);
        poVar5 = std::operator<<((ostream *)&std::cout,"broker restart in 2 seconds");
        std::endl<char,std::char_traits<char>>(poVar5);
        broker.brk.broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x1;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)&broker.brk);
        poVar5 = std::operator<<((ostream *)&std::cout,"broker restart in 1 seconds");
        std::endl<char,std::char_traits<char>>(poVar5);
        broker.brk.broker.super___shared_ptr<helics::Broker,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x1;
        std::this_thread::sleep_for<long,std::ratio<1l,1l>>
                  ((duration<long,_std::ratio<1L,_1L>_> *)&broker.brk);
        poVar5 = std::operator<<((ostream *)&std::cout,"broker restarting");
        std::endl<char,std::char_traits<char>>(poVar5);
      } while( true );
    }
    helics::BrokerApp::BrokerApp(&broker.brk,&cmdLine.remArgs);
    helics::BrokerKeeper::~BrokerKeeper(&broker);
  }
  PVar2 = OK;
  if (webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    (*((webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_TypedBrokerServer)._vptr_TypedBrokerServer[3])();
  }
  helics::cleanupHelicsLibrary();
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&webserver.super___shared_ptr<helics::apps::WebServer,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
LAB_001720d9:
  helics::helicsCLI11App::~helicsCLI11App(&cmdLine);
  std::__cxx11::string::~string((string *)&mWebSocketArgs);
  std::__cxx11::string::~string((string *)&mHttpArgs);
  return PVar2;
}

Assistant:

int main(int argc, char* argv[])  // NOLINT
{
    int ret{0};
    bool runterminal{false};
    bool runremote{false};
    bool autorestart{false};

    bool http_server{false};
    bool websocket_server{false};
#ifdef HELICS_ENABLE_WEBSERVER
    std::string mHttpArgs;
    std::string mWebSocketArgs;
#endif
    helics::helicsCLI11App cmdLine("helics broker command line");
    auto* term =
        cmdLine
            .add_subcommand(
                "term",
                "helics_broker term <broker args...> will start a broker and open a terminal control window "
                "for the broker run help in a terminal for more commands\n")
            ->prefix_command();
    term->callback([&runterminal]() { runterminal = true; });

    auto* remote =
        cmdLine
            .add_subcommand(
                "remote",
                "helics_broker remote <connection args>  will start a terminal and connect to a remote HELICS rest API and allow sending API commands through a terminal")
            ->prefix_command();
    remote->callback([&runremote]() { runremote = true; });

    cmdLine.add_flag(
        "--autorestart",
        autorestart,
        "helics_broker --autorestart <broker args ...> will start a continually regenerating broker "
        "there is a 3 second countdown on broker completion to halt the program via ctrl-C\n");

    cmdLine.add_flag("--http,--web",
                     http_server,
                     "start a webserver to respond to http rest api requests");
    cmdLine.add_flag("--websocket",
                     websocket_server,
                     "start a websocket server to respond to api requests");
#ifdef HELICS_ENABLE_WEBSERVER
    cmdLine
        .add_option("--http_server_args", mHttpArgs, "command line arguments for the http server")
        ->envname("HELICS_HTTP_ARGS");
    cmdLine
        .add_option("--websocket_server_args",
                    mWebSocketArgs,
                    "command line arguments for the websocket server")
        ->envname("HELICS_WEBSOCKET_ARGS");
#endif

    cmdLine
        .footer(
            "helics_broker <broker args ..> starts a broker with the given args and waits for it to "
            "complete\n")
        ->footer([]() {
            [[maybe_unused]] helics::BrokerApp app{"-?"};
            return std::string{};
        });
    cmdLine.allow_extras();
    cmdLine.set_config();
    cmdLine.addSystemInfoCall();
    auto parseResult = cmdLine.helics_parse(argc, argv);
    if (parseResult != helics::helicsCLI11App::ParseOutput::OK) {
        return (static_cast<int>(parseResult) > 0) ? 0 : static_cast<int>(parseResult);
    }
#ifdef HELICS_ENABLE_WEBSERVER
    std::shared_ptr<helics::apps::WebServer> webserver;
    if (http_server || websocket_server) {
        webserver = std::make_shared<helics::apps::WebServer>();
        webserver->enableHttpServer(http_server);
        if (!mHttpArgs.empty()) {
            webserver->processArgs(mHttpArgs);
        }
        webserver->enableWebSocketServer(websocket_server);
        if (!mWebSocketArgs.empty()) {
            webserver->processArgs(mWebSocketArgs);
        }
        webserver->startServer(nullptr, webserver);
    }
#else
    if (http_server || websocket_server) {
        std::cout
            << "the http webserver and websocket server are not available in this build please recompile with webserver enabled to utilize "
            << std::endl;
    }
#endif
    try {
        if (runterminal) {
            terminalFunction(cmdLine.remainArgs());
        } else if (runremote) {
            remoteTerminalFunction(cmdLine.remainArgs());
        } else if (autorestart) {
            while (true) {
                // I am purposely making an object that creates and destroys itself on the same line
                // because this will run until termination so will take a while
                {
                    helics::BrokerKeeper brkapp{cmdLine.remainArgs()};
                }
                std::cout << "broker restart in 3 seconds" << std::endl;
                std::this_thread::sleep_for(std::chrono::seconds(1));
                std::cout << "broker restart in 2 seconds" << std::endl;
                std::this_thread::sleep_for(std::chrono::seconds(1));
                std::cout << "broker restart in 1 seconds" << std::endl;
                std::this_thread::sleep_for(std::chrono::seconds(1));
                std::cout << "broker restarting" << std::endl;
            }
        } else {
            helics::BrokerKeeper broker(cmdLine.remainArgs());
        }
    }
    catch (const std::invalid_argument& ia) {
        std::cerr << ia.what() << std::endl;
        ret = -2;
    }
    catch (const helics::HelicsException& he) {
        std::cerr << he.what() << std::endl;
        ret = -4;
    }
#ifdef HELICS_ENABLE_WEBSERVER
    if (webserver) {
        webserver->stopServer();
    }
#endif
    helics::cleanupHelicsLibrary();
    return ret;
}